

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * __thiscall
lest::make_char_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  allocator<char> local_79;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_11;
  string *psStack_10;
  char chr_local;
  
  local_11 = (char)this;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,1,(char)this,&local_79);
  make_tran_string(&local_58,&local_78);
  std::operator+(&local_38,"\'",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_char_string(                char chr ) { return "\'" + make_tran_string( std::string( 1, chr ) ) + "\'" ; }